

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O0

void ritobin::io::json_impl::json_value_impl<ritobin::Map,_(ritobin::Category)7>::to_json_info
               (Map *value,json *json)

{
  bool bVar1;
  json_value *this;
  reference value_00;
  reference json_00;
  initializer_list_t init;
  string_t local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  string key;
  json key_json;
  Pair *item;
  const_iterator __end0;
  const_iterator __begin0;
  PairList *__range3;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  json *local_18;
  json *json_local;
  Map *value_local;
  
  local_18 = json;
  json_local = (json *)value;
  std::
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::initializer_list((initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)&__range3);
  init._M_len = (size_type)__range3;
  init._M_array = (iterator)&local_28;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::object(init);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(local_18,&local_28);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_28);
  this = &json_local->m_value;
  __end0 = std::vector<ritobin::Pair,_std::allocator<ritobin::Pair>_>::begin
                     ((vector<ritobin::Pair,_std::allocator<ritobin::Pair>_> *)this);
  item = (Pair *)std::vector<ritobin::Pair,_std::allocator<ritobin::Pair>_>::end
                           ((vector<ritobin::Pair,_std::allocator<ritobin::Pair>_> *)this);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_ritobin::Pair_*,_std::vector<ritobin::Pair,_std::allocator<ritobin::Pair>_>_>
                      (&__end0,(__normal_iterator<const_ritobin::Pair_*,_std::vector<ritobin::Pair,_std::allocator<ritobin::Pair>_>_>
                                *)&item);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    value_00 = __gnu_cxx::
               __normal_iterator<const_ritobin::Pair_*,_std::vector<ritobin::Pair,_std::allocator<ritobin::Pair>_>_>
               ::operator*(&__end0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)((long)&key.field_2 + 8),(nullptr_t)0x0);
    value_to_json_info(&value_00->key,(json *)((long)&key.field_2 + 8));
    std::__cxx11::string::string((string *)local_88);
    bVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::is_string((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)((long)&key.field_2 + 8));
    if (bVar1) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_a8,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)((long)&key.field_2 + 8));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 &local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    else {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::dump(&local_c8,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)((long)&key.field_2 + 8),-1,' ',false,strict);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 &local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    json_00 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator[](local_18,(key_type *)local_88);
    value_to_json_info(&value_00->value,json_00);
    std::__cxx11::string::~string((string *)local_88);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)((long)&key.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<const_ritobin::Pair_*,_std::vector<ritobin::Pair,_std::allocator<ritobin::Pair>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

static void to_json_info(T const& value, json& json) noexcept {
            json = json::object();
            for (auto const& item: value.items) {
                nlohmann::json key_json = {};
                value_to_json_info(item.key, key_json);
                std::string key;
                if (key_json.is_string()) {
                    key = key_json;
                } else {
                    key = key_json.dump();
                }
                value_to_json_info(item.value, json[key]);
            }
        }